

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_glnodes.cpp
# Opt level: O2

int CheckForMissingSegs(void)

{
  size_t __n;
  double *pdVar1;
  double *pdVar2;
  seg_t *psVar3;
  void *__s;
  long lVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  int i;
  long lVar8;
  double dVar9;
  TVector2<double> local_48;
  
  __n = (long)numsides * 8;
  uVar6 = 0xffffffffffffffff;
  if (-1 < (long)numsides) {
    uVar6 = __n;
  }
  __s = operator_new__(uVar6);
  memset(__s,0,__n);
  lVar8 = 0x10;
  iVar5 = numsegs;
  for (lVar7 = 0; psVar3 = segs, lVar7 < iVar5; lVar7 = lVar7 + 1) {
    if (*(long *)((long)&segs->v1 + lVar8) != 0) {
      pdVar1 = *(double **)((long)segs + lVar8 + -0x10);
      pdVar2 = *(double **)((long)segs + lVar8 + -8);
      local_48.X = *pdVar2 - *pdVar1;
      local_48.Y = pdVar2[1] - pdVar1[1];
      dVar9 = TVector2<double>::Length(&local_48);
      lVar4 = (*(long *)((long)&psVar3->v1 + lVar8) - (long)sides) / 0x18;
      *(double *)((long)__s + lVar4) = dVar9 + *(double *)((long)__s + lVar4);
      iVar5 = numsegs;
    }
    lVar8 = lVar8 + 0x30;
  }
  lVar8 = 0x14;
  iVar5 = 0;
  for (lVar7 = 0; lVar7 < numsides; lVar7 = lVar7 + 1) {
    lVar4 = *(long *)((long)sides->textures + lVar8 * 8 + -0x10);
    local_48.X = *(double *)(lVar4 + 0x10);
    local_48.Y = *(double *)(lVar4 + 0x18);
    dVar9 = TVector2<double>::Length(&local_48);
    pdVar1 = (double *)((long)__s + lVar7 * 8);
    iVar5 = iVar5 + (uint)(*pdVar1 <= dVar9 + -1.0 && dVar9 + -1.0 != *pdVar1);
    lVar8 = lVar8 + 0x18;
  }
  operator_delete__(__s);
  return iVar5;
}

Assistant:

static int CheckForMissingSegs()
{
	double *added_seglen = new double[numsides];
	int missing = 0;

	memset(added_seglen, 0, sizeof(double)*numsides);
	for(int i=0;i<numsegs;i++)
	{
		seg_t * seg = &segs[i];

		if (seg->sidedef!=NULL)
		{
			// check all the segs and calculate the length they occupy on their sidedef
			DVector2 vec1(seg->v2->fX() - seg->v1->fX(), seg->v2->fY() - seg->v1->fY());
			added_seglen[seg->sidedef - sides] += vec1.Length();
		}
	}

	for(int i=0;i<numsides;i++)
	{
		double linelen = sides[i].linedef->Delta().Length();
		missing += (added_seglen[i] < linelen - 1.);
	}

	delete [] added_seglen;
	return missing;
}